

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

uint32 __thiscall Js::JavascriptArray::GetNextIndexHelper<void*>(JavascriptArray *this,uint32 index)

{
  code *pcVar1;
  bool bVar2;
  SparseArraySegmentBase **ppSVar3;
  undefined4 *puVar4;
  SparseArraySegmentBase *pSVar5;
  uint local_2c;
  SparseArraySegmentBase *pSStack_28;
  uint i;
  SparseArraySegment<void_*> *current;
  uint candidateIndex;
  uint32 index_local;
  JavascriptArray *this_local;
  
  ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&this->head);
  if (*ppSVar3 == (SparseArraySegmentBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xae8,"(this->head)","array head should never be null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (index == 0xffffffff) {
    pSVar5 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&this->head);
    current._0_4_ = pSVar5->left;
  }
  else {
    current._0_4_ = index + 1;
  }
  pSStack_28 = GetBeginLookupSegment(this,(Type)current,true);
  do {
    if (pSStack_28 == (SparseArraySegmentBase *)0x0) {
      return 0xffffffff;
    }
    if ((pSStack_28->left <= (Type)current) &&
       ((Type)current - pSStack_28->left < pSStack_28->length)) {
      for (local_2c = (Type)current - pSStack_28->left; local_2c < pSStack_28->length;
          local_2c = local_2c + 1) {
        bVar2 = SparseArraySegment<void_*>::IsMissingItem<void>
                          ((WriteBarrierPtr<void> *)(&pSStack_28[1].left + (ulong)local_2c * 2));
        if (!bVar2) {
          return local_2c + pSStack_28->left;
        }
      }
    }
    ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&pSStack_28->next);
    pSStack_28 = &SparseArraySegment<void_*>::From(*ppSVar3)->super_SparseArraySegmentBase;
    if ((pSStack_28 != (SparseArraySegmentBase *)0x0) && ((Type)current < pSStack_28->left)) {
      current._0_4_ = pSStack_28->left;
    }
  } while( true );
}

Assistant:

uint32 JavascriptArray::GetNextIndexHelper(uint32 index) const
    {
        AssertMsg(this->head, "array head should never be null");
        uint candidateIndex;

        if (index == JavascriptArray::InvalidIndex)
        {
            candidateIndex = head->left;
        }
        else
        {
            candidateIndex = index + 1;
        }

        SparseArraySegment<T>* current = (SparseArraySegment<T>*)this->GetBeginLookupSegment(candidateIndex);

        while (current != nullptr)
        {
            if ((current->left <= candidateIndex) && ((candidateIndex - current->left) < current->length))
            {
                for (uint i = candidateIndex - current->left; i < current->length; i++)
                {
                    if (!SparseArraySegment<T>::IsMissingItem(&current->elements[i]))
                    {
                        return i + current->left;
                    }
                }
            }
            current = SparseArraySegment<T>::From(current->next);
            if (current != NULL)
            {
                if (candidateIndex < current->left)
                {
                    candidateIndex = current->left;
                }
            }
        }
        return JavascriptArray::InvalidIndex;
    }